

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* kratos::line_wrap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *text,uint32_t line_width)

{
  istream *piVar1;
  char *pcVar2;
  pointer pcVar3;
  istringstream local_1f8 [8];
  istringstream words;
  ios_base local_180 [264];
  undefined1 local_78 [8];
  string line;
  string word;
  
  std::__cxx11::istringstream::istringstream(local_1f8,(string *)text,_S_in);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._8_8_ = &word._M_string_length;
  word._M_dataplus._M_p = (pointer)0x0;
  word._M_string_length._0_1_ = 0;
  local_78 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  word.field_2._8_8_ = __return_storage_ptr__;
  piVar1 = std::operator>>((istream *)local_1f8,(string *)(line.field_2._M_local_buf + 8));
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::string::_M_append(local_78,line.field_2._8_8_);
    pcVar3 = (ulong)line_width - word._M_dataplus._M_p;
    while( true ) {
      piVar1 = std::operator>>((istream *)local_1f8,(string *)(line.field_2._M_local_buf + 8));
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if (pcVar3 < word._M_dataplus._M_p + 1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   word.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        std::__cxx11::string::_M_assign((string *)local_78);
        pcVar3 = (ulong)line_width - word._M_dataplus._M_p;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::append((char *)local_78);
        std::__cxx11::string::_M_append(pcVar2,line.field_2._8_8_);
        pcVar3 = pcVar3 + ~(ulong)word._M_dataplus._M_p;
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)word.field_2._8_8_
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if (local_78 != (undefined1  [8])&line._M_string_length) {
    operator_delete((void *)local_78,
                    CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1);
  }
  if ((size_type *)line.field_2._8_8_ != &word._M_string_length) {
    operator_delete((void *)line.field_2._8_8_,
                    CONCAT71(word._M_string_length._1_7_,(undefined1)word._M_string_length) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1f8);
  std::ios_base::~ios_base(local_180);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)word.field_2._8_8_;
}

Assistant:

std::vector<std::string> line_wrap(const std::string &text, uint32_t line_width) {
    // adapted from https://www.rosettacode.org/wiki/Word_wrap#C.2B.2B
    std::istringstream words(text);
    std::vector<std::string> result;
    std::string word;
    std::string line;

    if (words >> word) {
        line.append(word);
        size_t space_left = line_width - word.length();
        while (words >> word) {
            if (space_left < word.length() + 1) {
                result.emplace_back(line);
                line = word;
                space_left = line_width - word.length();
            } else {
                line.append(" ").append(word);
                space_left -= word.length() + 1;
            }
        }
    }
    result.emplace_back(line);
    return result;
}